

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall
dxil_spv::CFGNode::dominates_all_reachable_exits
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header)

{
  pointer ppCVar1;
  CFGNode *other;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  pointer ppCVar5;
  CFGNode *local_38;
  
  local_38 = this;
  sVar4 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&completed->_M_h,&local_38);
  bVar2 = true;
  if (sVar4 == 0) {
    local_38 = this;
    std::__detail::
    _Insert<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)completed,&local_38);
    if ((this->succ_back_edge == (CFGNode *)0x0) ||
       (bVar2 = dominates(header,this->succ_back_edge), bVar2)) {
      ppCVar5 = (this->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (this->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar2 = ppCVar5 == ppCVar1;
        if (bVar2) {
          return bVar2;
        }
        other = *ppCVar5;
        bVar3 = dominates(header,other);
        if (!bVar3) {
          return bVar2;
        }
        bVar3 = dominates_all_reachable_exits(other,completed,header);
        ppCVar5 = ppCVar5 + 1;
      } while (bVar3);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool CFGNode::dominates_all_reachable_exits(UnorderedSet<const CFGNode *> &completed, const CFGNode &header) const
{
	if (!completed.count(this))
	{
		completed.insert(this);
		if (succ_back_edge && !header.dominates(succ_back_edge))
			return false;

		for (auto *node : succ)
			if (!header.dominates(node) || !node->dominates_all_reachable_exits(completed, header))
				return false;
	}

	return true;
}